

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlCopyNamespace(xmlNsPtr cur)

{
  xmlNsPtr ret;
  xmlNsPtr cur_local;
  
  if (cur == (xmlNsPtr)0x0) {
    cur_local = (xmlNsPtr)0x0;
  }
  else if (cur->type == XML_NAMESPACE_DECL) {
    cur_local = xmlNewNs((xmlNodePtr)0x0,cur->href,cur->prefix);
  }
  else {
    cur_local = (xmlNsPtr)0x0;
  }
  return cur_local;
}

Assistant:

xmlNsPtr
xmlCopyNamespace(xmlNsPtr cur) {
    xmlNsPtr ret;

    if (cur == NULL) return(NULL);
    switch (cur->type) {
	case XML_LOCAL_NAMESPACE:
	    ret = xmlNewNs(NULL, cur->href, cur->prefix);
	    break;
	default:
#ifdef DEBUG_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "xmlCopyNamespace: invalid type %d\n", cur->type);
#endif
	    return(NULL);
    }
    return(ret);
}